

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O0

Vec_Int_t *
Acb_FindSupportMin(sat_solver *pSat,int iFirstDiv,Vec_Wrd_t *vPats,int *pnPats,Vec_Int_t *vSuppStart
                  )

{
  Vec_Int_t *pVVar1;
  int local_4c;
  Vec_Int_t *pVStack_48;
  int i;
  Vec_Int_t *vSupp;
  Vec_Int_t *vTemp;
  Vec_Int_t *vSuppStart_local;
  int *pnPats_local;
  Vec_Wrd_t *vPats_local;
  int iFirstDiv_local;
  sat_solver *pSat_local;
  
  pVStack_48 = Vec_IntDup(vSuppStart);
  local_4c = Vec_IntSize(pVStack_48);
  do {
    local_4c = local_4c + -1;
    if (local_4c < 0) {
      return pVStack_48;
    }
    pVVar1 = Acb_FindSupportMinOne(pSat,iFirstDiv,vPats,pnPats,pVStack_48,local_4c);
    if (pVStack_48 != pVVar1) {
      Vec_IntFree(pVStack_48);
    }
    pVStack_48 = pVVar1;
  } while (pVVar1 != (Vec_Int_t *)0x0);
  return (Vec_Int_t *)0x0;
}

Assistant:

Vec_Int_t * Acb_FindSupportMin( sat_solver * pSat, int iFirstDiv, Vec_Wrd_t * vPats, int * pnPats, Vec_Int_t * vSuppStart )
{
    Vec_Int_t * vTemp, * vSupp = Vec_IntDup( vSuppStart ); int i;
    for ( i = Vec_IntSize(vSupp)-1; i >= 0; i-- )
    {
        vSupp = Acb_FindSupportMinOne( pSat, iFirstDiv, vPats, pnPats, vTemp = vSupp, i );
        if ( vTemp != vSupp )
            Vec_IntFree( vTemp );
        if ( vSupp == NULL )
            return NULL;
    }
    return vSupp;
}